

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

Reference<std::allocator<absl::lts_20240722::status_internal::Payload>_> __thiscall
absl::lts_20240722::inlined_vector_internal::
Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
::EmplaceBackSlow<absl::lts_20240722::status_internal::Payload>
          (Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
           *this,Payload *args)

{
  CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_absl::lts_20240722::status_internal::Payload_*>
  CVar1;
  Pointer<std::allocator<absl::lts_20240722::status_internal::Payload>_> pPVar2;
  SizeType<std::allocator<absl::lts_20240722::status_internal::Payload>_> SVar3;
  move_iterator<absl::lts_20240722::status_internal::Payload_*> destroy_first;
  ulong uVar4;
  bool bVar5;
  AllocationTransaction<std::allocator<absl::lts_20240722::status_internal::Payload>_> allocation_tx
  ;
  IteratorValueAdapter<std::allocator<absl::lts_20240722::status_internal::Payload>,_std::move_iterator<absl::lts_20240722::status_internal::Payload_*>_>
  move_values;
  
  uVar4 = (this->metadata_).
          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  bVar5 = (uVar4 & 1) != 0;
  destroy_first._M_current = (Payload *)&this->data_;
  if (bVar5) {
    destroy_first._M_current = (this->data_).allocated.allocated_data;
  }
  allocation_tx.allocator_data_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_absl::lts_20240722::status_internal::Payload_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<absl::lts_20240722::status_internal::Payload_*,_1UL,_false>.value =
       (CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_absl::lts_20240722::status_internal::Payload_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
        )(Storage<absl::lts_20240722::status_internal::Payload_*,_1UL,_false>)0x0;
  allocation_tx.capacity_ = 0;
  SVar3 = 2;
  if (bVar5) {
    SVar3 = (this->data_).allocated.allocated_capacity * 2;
  }
  move_values.it_._M_current =
       (move_iterator<absl::lts_20240722::status_internal::Payload_*>)
       (move_iterator<absl::lts_20240722::status_internal::Payload_*>)destroy_first._M_current;
  pPVar2 = AllocationTransaction<std::allocator<absl::lts_20240722::status_internal::Payload>_>::
           Allocate(&allocation_tx,SVar3);
  uVar4 = uVar4 >> 1;
  status_internal::Payload::Payload(pPVar2 + uVar4,args);
  ConstructElements<std::allocator<absl::lts_20240722::status_internal::Payload>,absl::lts_20240722::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20240722::status_internal::Payload>,std::move_iterator<absl::lts_20240722::status_internal::Payload*>>>
            ((type_identity_t<std::allocator<absl::lts_20240722::status_internal::Payload>_> *)this,
             (Pointer<std::allocator<absl::lts_20240722::status_internal::Payload>_>)
             allocation_tx.allocator_data_.
             super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_absl::lts_20240722::status_internal::Payload_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
             .super_Storage<absl::lts_20240722::status_internal::Payload_*,_1UL,_false>.value,
             &move_values,uVar4);
  DestroyAdapter<std::allocator<absl::lts_20240722::status_internal::Payload>,_false>::
  DestroyElements((allocator<absl::lts_20240722::status_internal::Payload> *)this,
                  destroy_first._M_current,uVar4);
  DeallocateIfAllocated(this);
  SVar3 = allocation_tx.capacity_;
  CVar1 = allocation_tx.allocator_data_;
  allocation_tx.allocator_data_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_absl::lts_20240722::status_internal::Payload_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<absl::lts_20240722::status_internal::Payload_*,_1UL,_false>.value =
       (CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_absl::lts_20240722::status_internal::Payload_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
        )(Storage<absl::lts_20240722::status_internal::Payload_*,_1UL,_false>)0x0;
  allocation_tx.capacity_ = 0;
  (this->data_).allocated.allocated_data =
       (Pointer<std::allocator<absl::lts_20240722::status_internal::Payload>_>)
       CVar1.
       super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_absl::lts_20240722::status_internal::Payload_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
       .super_Storage<absl::lts_20240722::status_internal::Payload_*,_1UL,_false>.value;
  (this->data_).allocated.allocated_capacity = SVar3;
  (this->metadata_).
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<unsigned_long,_1UL,_false>.value =
       ((this->metadata_).
        super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
        .super_Storage<unsigned_long,_1UL,_false>.value | 1) + 2;
  AllocationTransaction<std::allocator<absl::lts_20240722::status_internal::Payload>_>::
  ~AllocationTransaction(&allocation_tx);
  return pPVar2 + uVar4;
}

Assistant:

auto Storage<T, N, A>::EmplaceBackSlow(Args&&... args) -> Reference<A> {
  StorageView<A> storage_view = MakeStorageView();
  AllocationTransaction<A> allocation_tx(GetAllocator());
  IteratorValueAdapter<A, MoveIterator<A>> move_values(
      MoveIterator<A>(storage_view.data));
  SizeType<A> requested_capacity = NextCapacity(storage_view.capacity);
  Pointer<A> construct_data = allocation_tx.Allocate(requested_capacity);
  Pointer<A> last_ptr = construct_data + storage_view.size;

  // Construct new element.
  AllocatorTraits<A>::construct(GetAllocator(), last_ptr,
                                std::forward<Args>(args)...);
  // Move elements from old backing store to new backing store.
  ABSL_INTERNAL_TRY {
    ConstructElements<A>(GetAllocator(), allocation_tx.GetData(), move_values,
                         storage_view.size);
  }